

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sftp.c
# Opt level: O1

WildcardMatcher * begin_wildcard_matching(char *name)

{
  int iVar1;
  WildcardMatcher *__pglob;
  
  __pglob = (WildcardMatcher *)safemalloc(1,0x50,0);
  iVar1 = glob(name,0,(__errfunc *)0x0,(glob_t *)__pglob);
  if (iVar1 < 0) {
    safefree(__pglob);
    __pglob = (WildcardMatcher *)0x0;
  }
  else {
    __pglob->i = 0;
  }
  return __pglob;
}

Assistant:

WildcardMatcher *begin_wildcard_matching(const char *name) {
    WildcardMatcher *ret = snew(WildcardMatcher);

    if (glob(name, 0, NULL, &ret->globbed) < 0) {
        sfree(ret);
        return NULL;
    }

    ret->i = 0;

    return ret;
}